

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

string * kmer_to_sequence_abi_cxx11_(uint64_t kmer,uint8_t k)

{
  byte in_DL;
  ulong in_RSI;
  char cVar1;
  string *in_RDI;
  int shift;
  string *seq;
  int local_28;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_28 = (in_DL - 1) * 2; -1 < local_28; local_28 = local_28 + -2) {
    cVar1 = (char)in_RDI;
    switch((uint)(in_RSI >> ((byte)local_28 & 0x3f)) & 3) {
    case 0:
      std::__cxx11::string::push_back(cVar1);
      break;
    case 1:
      std::__cxx11::string::push_back(cVar1);
      break;
    case 2:
      std::__cxx11::string::push_back(cVar1);
      break;
    case 3:
      std::__cxx11::string::push_back(cVar1);
    }
  }
  return in_RDI;
}

Assistant:

std::string kmer_to_sequence(uint64_t kmer, uint8_t k) {
    std::string seq;
    seq.reserve(k);
    for (int shift=(k-1)*2;shift>=0;shift-=2) {
        //std::cout<<"kmer: "
        switch ((kmer>>shift)%4){
            case 0:
                seq.push_back('A');
                break;
            case 1:
                seq.push_back('C');
                break;
            case 2:
                seq.push_back('G');
                break;
            case 3:
                seq.push_back('T');
                break;
        }
    }
    return seq;
}